

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

bool Ptex::v2_2::PtexUtils::isConstant(void *data,int stride,int ures,int vres,int pixelSize)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  void *in_RDI;
  int in_R8D;
  int i_1;
  int i;
  char *p;
  int rowlen;
  int local_38;
  int local_34;
  void *local_30;
  
  local_30 = (void *)((long)in_RDI + (long)in_ESI);
  for (local_34 = 1; local_34 < in_ECX; local_34 = local_34 + 1) {
    iVar1 = memcmp(in_RDI,local_30,(long)(in_R8D * in_EDX));
    if (iVar1 != 0) {
      return false;
    }
    local_30 = (void *)((long)local_30 + (long)in_ESI);
  }
  local_30 = (void *)((long)in_RDI + (long)in_R8D);
  local_38 = 1;
  while( true ) {
    if (in_EDX <= local_38) {
      return true;
    }
    iVar1 = memcmp(in_RDI,local_30,(long)in_R8D);
    if (iVar1 != 0) break;
    local_38 = local_38 + 1;
    local_30 = (void *)((long)local_30 + (long)in_R8D);
  }
  return false;
}

Assistant:

bool isConstant(const void* data, int stride, int ures, int vres,
                int pixelSize)
{
    int rowlen = pixelSize * ures;
    const char* p = (const char*) data + stride;

    // compare each row with the first
    for (int i = 1; i < vres; i++, p += stride)
        if (0 != memcmp(data, p, rowlen)) return 0;

    // make sure first row is constant
    p = (const char*) data + pixelSize;
    for (int i = 1; i < ures; i++, p += pixelSize)
        if (0 != memcmp(data, p, pixelSize)) return 0;

    return 1;
}